

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall p2t::Sweep::FillAdvancingFront(Sweep *this,SweepContext *tcx,Node *n)

{
  bool bVar1;
  double dVar2;
  double angle;
  Node *node;
  Node *n_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  angle = (double)n->next;
  while ((*(long *)((long)angle + 0x10) != 0 &&
         (bVar1 = LargeHole_DontFill(this,(Node *)angle), !bVar1))) {
    Fill(this,tcx,(Node *)angle);
    angle = *(double *)((long)angle + 0x10);
  }
  angle = (double)n->prev;
  while ((*(long *)((long)angle + 0x18) != 0 &&
         (bVar1 = LargeHole_DontFill(this,(Node *)angle), !bVar1))) {
    Fill(this,tcx,(Node *)angle);
    angle = *(double *)((long)angle + 0x18);
  }
  if ((n->next != (Node *)0x0) &&
     ((n->next->next != (Node *)0x0 && (dVar2 = BasinAngle(this,n), dVar2 < 2.356194490192345)))) {
    FillBasin(this,tcx,n);
  }
  return;
}

Assistant:

void Sweep::FillAdvancingFront(SweepContext& tcx, Node& n)
{

  // Fill right holes
  Node* node = n.next;

  while (node->next) {
    // if HoleAngle exceeds 90 degrees then break.
    if (LargeHole_DontFill(node)) break;
    Fill(tcx, *node);
    node = node->next;
  }

  // Fill left holes
  node = n.prev;

  while (node->prev) {
    // if HoleAngle exceeds 90 degrees then break.
    if (LargeHole_DontFill(node)) break;
    Fill(tcx, *node);
    node = node->prev;
  }

  // Fill right basins
  if (n.next && n.next->next) {
    const double angle = BasinAngle(n);
    if (angle < PI_3div4) {
      FillBasin(tcx, n);
    }
  }
}